

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void __thiscall
embree::TutorialApplication::renderToFile(TutorialApplication *this,FileName *fileName)

{
  uint uVar1;
  Col4<unsigned_char> *color;
  ImageT<embree::Col4<unsigned_char>_> *this_00;
  uint uVar2;
  TutorialApplication *this_01;
  Ref<embree::Image> image;
  ISPCCamera ispccamera;
  Ref<embree::Image> local_98;
  FileName *local_90;
  string local_88;
  
  local_90 = fileName;
  resize(this,this->width,this->height);
  this_01 = (TutorialApplication *)&stack0xffffffffffffff9c;
  Camera::getISPCCamera((ISPCCamera *)this_01,&this->camera,(ulong)this->width,(ulong)this->height);
  initRayStats(this_01);
  if (this->numFrames != 0) {
    uVar2 = 0;
    do {
      (*(this->super_Application)._vptr_Application[0xb])
                (this->render_time,this,this->pixels,(ulong)this->width,(ulong)this->height,
                 &stack0xffffffffffffff9c);
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->numFrames);
  }
  this_00 = (ImageT<embree::Col4<unsigned_char>_> *)operator_new(0x48);
  uVar2 = this->width;
  uVar1 = this->height;
  color = (Col4<unsigned_char> *)this->pixels;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"");
  ImageT<embree::Col4<unsigned_char>_>::ImageT
            (this_00,(ulong)uVar2,(ulong)uVar1,color,true,&local_88,false);
  local_98.ptr = (Image *)this_00;
  (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  storeImage(&local_98,local_90);
  if ((ImageT<embree::Col4<unsigned_char>_> *)local_98.ptr !=
      (ImageT<embree::Col4<unsigned_char>_> *)0x0) {
    (*(((Image *)&(local_98.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
  }
  return;
}

Assistant:

void TutorialApplication::renderToFile(const FileName& fileName)
  {
    resize(width,height);
    ISPCCamera ispccamera = camera.getISPCCamera(width,height);
    initRayStats();
    
    for (unsigned int i=0; i<numFrames; i++)
      render(pixels,width,height,render_time,ispccamera);
    
    Ref<Image> image = new Image4uc(width, height, (Col4uc*)pixels);
    storeImage(image, fileName);
  }